

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_HandleXrun(PaAlsaStream *self)

{
  snd_pcm_t *psVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  int abort;
  undefined1 *puVar4;
  char *format;
  undefined1 *__s;
  bool bVar5;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  long local_40;
  snd_timestamp_t t;
  
  uStack_50 = 0x113726;
  t.tv_usec = (__suseconds_t)PaUtil_GetTime();
  uStack_50 = 0x113730;
  __n = snd_pcm_status_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_48 + lVar2;
  abort = 0;
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x11374e;
  memset(__s,0,__n);
  bVar5 = true;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113765;
    puVar4 = __s;
    snd_pcm_status();
    abort = (int)puVar4;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x11376d;
    iVar3 = snd_pcm_status_get_state(__s);
    if (iVar3 == 4) {
      abort = (int)&local_40;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113781;
      snd_pcm_status_get_trigger_tstamp(__s);
      self->underrun =
           (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
      if ((self->playback).canMmap == 0) {
        psVar1 = (self->playback).pcm;
        abort = -0x20;
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1137d5;
        iVar3 = snd_pcm_recover(psVar1,0xffffffe0,0);
        bVar5 = -1 < iVar3;
      }
      else {
        bVar5 = false;
      }
    }
  }
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1137f3;
    puVar4 = __s;
    snd_pcm_status();
    abort = (int)puVar4;
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1137fb;
    iVar3 = snd_pcm_status_get_state(__s);
    if (iVar3 == 4) {
      abort = (int)&local_40;
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x11380f;
      snd_pcm_status_get_trigger_tstamp(__s);
      self->overrun =
           (double)t.tv_usec * 1000.0 - ((double)local_40 * 1000.0 + (double)t.tv_sec / 1000.0);
      if ((self->capture).canMmap == 0) {
        psVar1 = (self->capture).pcm;
        abort = -0x20;
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113868;
        iVar3 = snd_pcm_recover(psVar1,0xffffffe0,0);
        if ((bool)(-1 < iVar3 & bVar5)) {
          return 0;
        }
      }
      goto LAB_00113879;
    }
  }
  if (bVar5) {
    return 0;
  }
LAB_00113879:
  *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x113888;
  paUtilErr_ = PaUnixMutex_Lock(&self->stateMtx);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaUnixMutex_Lock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3307\n"
    ;
  }
  else {
    *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x11389e;
    paUtilErr_ = AlsaStop(self,abort);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'AlsaStop( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3308\n"
      ;
    }
    else {
      *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1138b4;
      paUtilErr_ = AlsaStart(self,abort);
      if (-1 < paUtilErr_) {
        *(undefined8 *)(auStack_48 + lVar2 + -8) = 0x1138cd;
        paUtilErr_ = PaUnixMutex_Unlock(&self->stateMtx);
        if (-1 < paUtilErr_) {
          paUtilErr_ = 0;
          return 0;
        }
        *(undefined **)(auStack_48 + lVar2 + -8) = &UNK_00113907;
        PaUtil_DebugPrint(
                         "Expression \'PaUnixMutex_Unlock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3314\n"
                         );
      }
      format = 
      "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3309\n"
      ;
    }
  }
  *(undefined **)(auStack_48 + lVar2 + -8) = &UNK_00113959;
  PaUtil_DebugPrint(format);
}

Assistant:

static PaError PaAlsaStream_HandleXrun( PaAlsaStream *self )
{
    PaError result = paNoError;
    snd_pcm_status_t *st;
    PaTime now = PaUtil_GetTime();
    snd_timestamp_t t;
    int restartAlsa = 0; /* do not restart Alsa by default */

    alsa_snd_pcm_status_alloca( &st );

    if( self->playback.pcm )
    {
        alsa_snd_pcm_status( self->playback.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->underrun = now * 1000 - ( (PaTime)t.tv_sec * 1000 + (PaTime)t.tv_usec / 1000 );

            if( !self->playback.canMmap )
            {
                if( alsa_snd_pcm_recover( self->playback.pcm, -EPIPE, 0 ) < 0 )
                {
                    PA_DEBUG(( "%s: [playback] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }
    if( self->capture.pcm )
    {
        alsa_snd_pcm_status( self->capture.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->overrun = now * 1000 - ((PaTime) t.tv_sec * 1000 + (PaTime) t.tv_usec / 1000);

            if (!self->capture.canMmap)
            {
                if (alsa_snd_pcm_recover( self->capture.pcm, -EPIPE, 0 ) < 0)
                {
                    PA_DEBUG(( "%s: [capture] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }

    if( restartAlsa )
    {
        PA_DEBUG(( "%s: restarting Alsa to recover from XRUN\n", __FUNCTION__ ));
        PA_ENSURE( AlsaRestart( self ) );
    }

end:
    return result;
error:
    goto end;
}